

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

void I_ShutdownMusic(bool onexit)

{
  bool onexit_local;
  
  if (!MusicDown) {
    MusicDown = true;
    if ((currSong != (MusInfo *)0x0) && (S_StopMusic(true), currSong != (MusInfo *)0x0)) {
      __assert_fail("currSong == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/i_music.cpp"
                    ,0xbd,"void I_ShutdownMusic(bool)");
    }
    Timidity::FreeAll();
    if (onexit) {
      WildMidi_Shutdown();
    }
  }
  return;
}

Assistant:

void I_ShutdownMusic(bool onexit)
{
	if (MusicDown)
		return;
	MusicDown = true;
	if (currSong)
	{
		S_StopMusic (true);
		assert (currSong == NULL);
	}
	Timidity::FreeAll();
	if (onexit) WildMidi_Shutdown();
#ifdef _WIN32
	I_ShutdownMusicWin32();
#endif // _WIN32
}